

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

String * File::getDirectoryName(String *__return_storage_ptr__,String *file)

{
  char *pcVar1;
  usize uVar2;
  char *local_28;
  char *pos;
  char *start;
  String *file_local;
  
  pcVar1 = String::operator_cast_to_char_(file);
  uVar2 = String::length(file);
  local_28 = pcVar1 + (uVar2 - 1);
  while( true ) {
    if (local_28 < pcVar1) {
      String::String<2ul>(__return_storage_ptr__,(char (*) [2])0x12a418);
      return __return_storage_ptr__;
    }
    if ((*local_28 == '\\') || (*local_28 == '/')) break;
    local_28 = local_28 + -1;
  }
  String::substr(__return_storage_ptr__,file,0,(long)local_28 - (long)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

String File::getDirectoryName(const String& file)
{
  const char* start = file;
  const char* pos = &start[file.length() - 1];
  for(; pos >= start; --pos)
    if(*pos == '\\' || *pos == '/')
      return file.substr(0, pos - start);
  return String(".");
}